

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBColorMatrixRow_C(uint8_t *src_argb,uint8_t *dst_argb,int8_t *matrix_argb,int width)

{
  uint32_t uVar1;
  int in_ECX;
  undefined1 *in_RSI;
  int sa;
  int sr;
  int sg;
  int sb;
  int a;
  int r;
  int g;
  int b;
  int x;
  int local_20;
  undefined1 *local_10;
  
  local_10 = in_RSI;
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    uVar1 = libyuv::Clamp(0);
    *local_10 = (char)uVar1;
    uVar1 = libyuv::Clamp(0);
    local_10[1] = (char)uVar1;
    uVar1 = libyuv::Clamp(0);
    local_10[2] = (char)uVar1;
    uVar1 = libyuv::Clamp(0);
    local_10[3] = (char)uVar1;
    local_10 = local_10 + 4;
  }
  return;
}

Assistant:

void ARGBColorMatrixRow_C(const uint8_t* src_argb,
                          uint8_t* dst_argb,
                          const int8_t* matrix_argb,
                          int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = src_argb[0];
    int g = src_argb[1];
    int r = src_argb[2];
    int a = src_argb[3];
    int sb = (b * matrix_argb[0] + g * matrix_argb[1] + r * matrix_argb[2] +
              a * matrix_argb[3]) >>
             6;
    int sg = (b * matrix_argb[4] + g * matrix_argb[5] + r * matrix_argb[6] +
              a * matrix_argb[7]) >>
             6;
    int sr = (b * matrix_argb[8] + g * matrix_argb[9] + r * matrix_argb[10] +
              a * matrix_argb[11]) >>
             6;
    int sa = (b * matrix_argb[12] + g * matrix_argb[13] + r * matrix_argb[14] +
              a * matrix_argb[15]) >>
             6;
    dst_argb[0] = Clamp(sb);
    dst_argb[1] = Clamp(sg);
    dst_argb[2] = Clamp(sr);
    dst_argb[3] = Clamp(sa);
    src_argb += 4;
    dst_argb += 4;
  }
}